

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvctrl.c
# Opt level: O1

int ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *x4;
  char *x5;
  strerr *se;
  undefined1 local_9;
  
  local_9 = (undefined1)type;
  __fd = open_write("supervise/control");
  if (__fd == -1) {
    piVar2 = __errno_location();
    rc = rc + 1;
    if (*piVar2 == error_nodevice) {
      se = (strerr *)0x0;
      x4 = "runsv not running.";
      x5 = (char *)0x0;
      goto LAB_0010231f;
    }
    x4 = "unable to open supervise/control";
  }
  else {
    sVar1 = write(__fd,&local_9,1);
    if (sVar1 == 1) {
      return 1;
    }
    rc = rc + 1;
    x4 = "unable to write to supervise/control";
  }
  se = &strerr_sys;
  x5 = ": ";
LAB_0010231f:
  strerr_warn("runsvctrl: warning: ",(char *)ctx,": ",x4,x5,(char *)0x0,se);
  return -1;
}

Assistant:

int ctrl(char *name, char c) {
  int fd;

  if ((fd =open_write("supervise/control")) == -1) {
    if (errno == error_nodevice)
      warnx(name, "runsv not running.");
    else
      warn(name, "unable to open supervise/control");
    return(-1);
  }
  if (write(fd, &c, 1) != 1) {
    warn(name, "unable to write to supervise/control");
    return(-1);
  }
  return(1);
}